

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus_test.c
# Opt level: O3

void test_bus_identity(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *local_38;
  char *n;
  uint16_t p;
  nng_socket s;
  
  nVar1 = nng_bus0_open((nng_socket *)((long)&n + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x1b,"%s: expected success, got %s (%d)","nng_bus0_open(&s)",pcVar3,nVar1)
  ;
  if (iVar2 != 0) {
    nVar1 = nng_socket_proto_id(n._4_4_,(uint16_t *)((long)&n + 2));
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x1c,"%s: expected success, got %s (%d)","nng_socket_proto_id(s, &p)",
                           pcVar3,nVar1);
    if (iVar2 != 0) {
      acutest_check_((uint)(n._2_2_ == 0x70),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                     ,0x1d,"%s","p == BUS0_SELF");
      nVar1 = nng_socket_peer_id(n._4_4_,(uint16_t *)((long)&n + 2));
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                             ,0x1e,"%s: expected success, got %s (%d)","nng_socket_peer_id(s, &p)",
                             pcVar3,nVar1);
      if (iVar2 != 0) {
        acutest_check_((uint)(n._2_2_ == 0x70),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                       ,0x1f,"%s","p == BUS0_PEER");
        nVar1 = nng_socket_proto_name(n._4_4_,&local_38);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                               ,0x20,"%s: expected success, got %s (%d)",
                               "nng_socket_proto_name(s, &n)",pcVar3,nVar1);
        pcVar3 = local_38;
        if (iVar2 != 0) {
          iVar2 = strcmp(local_38,"bus");
          acutest_check_((uint)(iVar2 == 0),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x21,"%s == %s",pcVar3,"bus",nVar1);
          nVar1 = nng_socket_peer_name(n._4_4_,&local_38);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                 ,0x22,"%s: expected success, got %s (%d)",
                                 "nng_socket_peer_name(s, &n)",pcVar3,nVar1);
          if (iVar2 != 0) {
            iVar2 = strcmp(local_38,"bus");
            acutest_check_((uint)(iVar2 == 0),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x23,"%s == %s",local_38,"bus",nVar1);
            nVar1 = nng_socket_close(n._4_4_);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                   ,0x24,"%s: expected success, got %s (%d)","nng_socket_close(s)",
                                   pcVar3,nVar1);
            if (iVar2 != 0) {
              return;
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_bus_identity(void)
{
	nng_socket  s;
	uint16_t    p;
	const char *n;

	NUTS_PASS(nng_bus0_open(&s));
	NUTS_PASS(nng_socket_proto_id(s, &p));
	NUTS_TRUE(p == BUS0_SELF);
	NUTS_PASS(nng_socket_peer_id(s, &p));
	NUTS_TRUE(p == BUS0_PEER); // 49
	NUTS_PASS(nng_socket_proto_name(s, &n));
	NUTS_MATCH(n, BUS0_SELF_NAME);
	NUTS_PASS(nng_socket_peer_name(s, &n));
	NUTS_MATCH(n, BUS0_PEER_NAME);
	NUTS_CLOSE(s);
}